

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O0

Aig_Man_t * Iso_ManFilterPos(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  Vec_Str_t *p;
  Vec_Int_t *p_00;
  Vec_Ptr_t **pAig_00;
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Vec_Ptr_t *p_01;
  Vec_Int_t *Entry;
  int *pPos;
  abctime clk2;
  abctime clkIso;
  abctime clkAig;
  abctime clkDup;
  abctime clk;
  int nPos;
  int i;
  Vec_Str_t *vPrev;
  Vec_Str_t *vStr;
  Vec_Int_t *vRemain;
  Vec_Int_t *vLevel;
  Vec_Ptr_t *vClasses;
  Vec_Ptr_t *vBuffers;
  Aig_Man_t *pTemp;
  Aig_Man_t *pPart;
  Vec_Ptr_t **ppVStack_18;
  int fVerbose_local;
  Vec_Ptr_t **pvPosEquivs_local;
  Aig_Man_t *pAig_local;
  
  pPart._4_4_ = fVerbose;
  ppVStack_18 = pvPosEquivs;
  pvPosEquivs_local = (Vec_Ptr_t **)pAig;
  Abc_Clock();
  clkAig = 0;
  clkIso = 0;
  clk2 = 0;
  *ppVStack_18 = (Vec_Ptr_t *)0x0;
  iVar1 = Aig_ManCoNum((Aig_Man_t *)pvPosEquivs_local);
  iVar2 = Aig_ManRegNum((Aig_Man_t *)pvPosEquivs_local);
  clk._0_4_ = iVar1 - iVar2;
  vClasses = Vec_PtrAlloc((int)clk);
  for (clk._4_4_ = 0; (int)clk._4_4_ < (int)clk; clk._4_4_ = clk._4_4_ + 1) {
    if ((int)clk._4_4_ % 100 == 0) {
      printf("%6d finished...\r",(ulong)clk._4_4_);
    }
    aVar3 = Abc_Clock();
    pTemp = Saig_ManDupCones((Aig_Man_t *)pvPosEquivs_local,(int *)((long)&clk + 4),1);
    aVar4 = Abc_Clock();
    clkAig = (aVar4 - aVar3) + clkAig;
    aVar3 = Abc_Clock();
    vBuffers = (Vec_Ptr_t *)Saig_ManDupIsoCanonical(pTemp,0);
    aVar4 = Abc_Clock();
    clk2 = (aVar4 - aVar3) + clk2;
    aVar3 = Abc_Clock();
    vPrev = Ioa_WriteAigerIntoMemoryStr((Aig_Man_t *)vBuffers);
    aVar4 = Abc_Clock();
    clkIso = (aVar4 - aVar3) + clkIso;
    Vec_PtrPush(vClasses,vPrev);
    Aig_ManStop((Aig_Man_t *)vBuffers);
    Aig_ManStop(pTemp);
    vPrev->nCap = clk._4_4_;
  }
  if (pPart._4_4_ != 0) {
    Abc_PrintTime(1,"Duplicate time",clkAig);
    Abc_PrintTime(1,"Isomorph  time",clk2);
    Abc_PrintTime(1,"AIGER     time",clkIso);
  }
  Abc_Clock();
  Vec_PtrSort(vClasses,Iso_StoCompareVecStr);
  aVar3 = Abc_Clock();
  iVar1 = Saig_ManPoNum((Aig_Man_t *)pvPosEquivs_local);
  p_01 = Vec_PtrAlloc(iVar1);
  vLevel = (Vec_Int_t *)p_01;
  vRemain = Vec_IntAlloc(4);
  Vec_PtrPush(p_01,vRemain);
  _nPos = (Vec_Str_t *)Vec_PtrEntry(vClasses,0);
  Vec_IntPush(vRemain,_nPos->nCap);
  for (clk._4_4_ = 1; iVar1 = clk._4_4_, iVar2 = Vec_PtrSize(vClasses), iVar1 < iVar2;
      clk._4_4_ = clk._4_4_ + 1) {
    vPrev = (Vec_Str_t *)Vec_PtrEntry(vClasses,clk._4_4_);
    iVar1 = Vec_StrCompareVec(_nPos,vPrev);
    p_00 = vLevel;
    if (iVar1 != 0) {
      Entry = Vec_IntAlloc(4);
      Vec_PtrPush((Vec_Ptr_t *)p_00,Entry);
    }
    vRemain = (Vec_Int_t *)Vec_PtrEntryLast((Vec_Ptr_t *)vLevel);
    Vec_IntPush(vRemain,vPrev->nCap);
    _nPos = vPrev;
  }
  Vec_VecFree((Vec_Vec_t *)vClasses);
  if (pPart._4_4_ != 0) {
    aVar4 = Abc_Clock();
    Abc_PrintTime(1,"Sorting   time",aVar4 - aVar3);
  }
  for (clk._4_4_ = 0; iVar1 = clk._4_4_, iVar2 = Vec_PtrSize((Vec_Ptr_t *)vLevel), iVar1 < iVar2;
      clk._4_4_ = clk._4_4_ + 1) {
    vRemain = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vLevel,clk._4_4_);
    Vec_IntSort(vRemain,0);
  }
  Vec_VecSortByFirstInt((Vec_Vec_t *)vLevel,0);
  vStr = (Vec_Str_t *)Vec_IntAlloc(100);
  for (clk._4_4_ = 0; iVar1 = clk._4_4_, iVar2 = Vec_PtrSize((Vec_Ptr_t *)vLevel),
      pAig_00 = pvPosEquivs_local, iVar1 < iVar2; clk._4_4_ = clk._4_4_ + 1) {
    vRemain = (Vec_Int_t *)Vec_PtrEntry((Vec_Ptr_t *)vLevel,clk._4_4_);
    p = vStr;
    iVar1 = Vec_IntEntry(vRemain,0);
    Vec_IntPush((Vec_Int_t *)p,iVar1);
  }
  pPos = Vec_IntArray((Vec_Int_t *)vStr);
  iVar1 = Vec_IntSize((Vec_Int_t *)vStr);
  pTemp = Saig_ManDupCones((Aig_Man_t *)pAig_00,pPos,iVar1);
  Vec_IntFree((Vec_Int_t *)vStr);
  *ppVStack_18 = (Vec_Ptr_t *)vLevel;
  return pTemp;
}

Assistant:

Aig_Man_t * Iso_ManFilterPos( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
//    int fVeryVerbose = 0;
    Aig_Man_t * pPart, * pTemp;
    Vec_Ptr_t * vBuffers, * vClasses;
    Vec_Int_t * vLevel, * vRemain;
    Vec_Str_t * vStr, * vPrev;
    int i, nPos;
    abctime clk = Abc_Clock();
    abctime clkDup = 0, clkAig = 0, clkIso = 0, clk2;
    *pvPosEquivs = NULL;

    // derive AIG for each PO
    nPos = Aig_ManCoNum(pAig) - Aig_ManRegNum(pAig);
    vBuffers = Vec_PtrAlloc( nPos );
    for ( i = 0; i < nPos; i++ )
    {
        if ( i % 100 == 0 )
            printf( "%6d finished...\r", i );

        clk2 = Abc_Clock();
        pPart = Saig_ManDupCones( pAig, &i, 1 );
        clkDup += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        pTemp = Saig_ManDupIsoCanonical( pPart, 0 );
        clkIso += Abc_Clock() - clk2;

        clk2 = Abc_Clock();
        vStr  = Ioa_WriteAigerIntoMemoryStr( pTemp );
        clkAig += Abc_Clock() - clk2;

        Vec_PtrPush( vBuffers, vStr );
        Aig_ManStop( pTemp );
        Aig_ManStop( pPart );
        // remember the output number in nCap (attention: hack!)
        vStr->nCap = i;
    }
//    s_Counter = 0;
    if ( fVerbose )
    {
    Abc_PrintTime( 1, "Duplicate time", clkDup );
    Abc_PrintTime( 1, "Isomorph  time", clkIso );
    Abc_PrintTime( 1, "AIGER     time", clkAig );
    }

    // sort the infos
    clk = Abc_Clock();
    Vec_PtrSort( vBuffers, (int (*)(void))Iso_StoCompareVecStr );

    // create classes
    clk = Abc_Clock();
    vClasses = Vec_PtrAlloc( Saig_ManPoNum(pAig) );
    // start the first class
    Vec_PtrPush( vClasses, (vLevel = Vec_IntAlloc(4)) );
    vPrev = (Vec_Str_t *)Vec_PtrEntry( vBuffers, 0 );
    Vec_IntPush( vLevel, vPrev->nCap );
    // consider other classes
    Vec_PtrForEachEntryStart( Vec_Str_t *, vBuffers, vStr, i, 1 )
    {
        if ( Vec_StrCompareVec(vPrev, vStr) )
            Vec_PtrPush( vClasses, Vec_IntAlloc(4) );
        vLevel = (Vec_Int_t *)Vec_PtrEntryLast( vClasses );
        Vec_IntPush( vLevel, vStr->nCap );
        vPrev = vStr;
    }
    Vec_VecFree( (Vec_Vec_t *)vBuffers );

    if ( fVerbose )
    Abc_PrintTime( 1, "Sorting   time", Abc_Clock() - clk );
//    Abc_PrintTime( 1, "Traversal time", time_Trav );

    // report the results
//    Vec_VecPrintInt( (Vec_Vec_t *)vClasses );
//    printf( "Devided %d outputs into %d cand equiv classes.\n", Saig_ManPoNum(pAig), Vec_PtrSize(vClasses) );
/*
    if ( fVerbose )
    {
        Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
            if ( Vec_IntSize(vLevel) > 1 )
                printf( "%d ", Vec_IntSize(vLevel) );
            else
                nUnique++;
        printf( " Unique = %d\n", nUnique );
    }
*/

    // canonicize order
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntSort( vLevel, 0 );
     Vec_VecSortByFirstInt( (Vec_Vec_t *)vClasses, 0 );
       
    // collect the first ones
    vRemain = Vec_IntAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Int_t *, vClasses, vLevel, i )
        Vec_IntPush( vRemain, Vec_IntEntry(vLevel, 0) );

    // derive the resulting AIG
    pPart = Saig_ManDupCones( pAig, Vec_IntArray(vRemain), Vec_IntSize(vRemain) );
    Vec_IntFree( vRemain );

//    return (Vec_Vec_t *)vClasses;
//    Vec_VecFree( (Vec_Vec_t *)vClasses );
    *pvPosEquivs = vClasses;
    return pPart;
}